

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primetest.cpp
# Opt level: O0

int64_t power(int a,int n,int mod)

{
  undefined8 local_28;
  int64_t result;
  int64_t power;
  undefined4 local_10;
  int mod_local;
  int n_local;
  int a_local;
  
  result = (int64_t)a;
  local_28 = 1;
  for (local_10 = n; local_10 != 0; local_10 = (int)local_10 >> 1) {
    if ((local_10 & 1) != 0) {
      local_28 = (local_28 * result) % (long)mod;
    }
    result = (result * result) % (long)mod;
  }
  return local_28;
}

Assistant:

int64_t power(int a, int n, int mod)
{
	int64_t power = a, result = 1;

	while (n)
	{
		if (n & 1)
			result = (result*power) % mod;
		power = (power*power) % mod;
		n >>= 1;
	}
	return result;
}